

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:306:36)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:306:36)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  double val;
  gc_heap_ptr_untyped gStack_78;
  gc_heap_ptr_untyped local_68;
  gc_heap_ptr_untyped local_58;
  value local_48;
  
  h = (this->f).prototype.super_gc_heap_ptr_untyped.heap_;
  val = anon_unknown_37::date_helper::current_time_utc();
  make_date_object::anon_class_16_1_f1e7abc2::operator()((anon_class_16_1_f1e7abc2 *)&local_58,val);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&gStack_78,&local_58);
  value::value(&local_48,(object_ptr *)&gStack_78);
  to_string((mjs *)&local_68,h,&local_48);
  value::value(__return_storage_ptr__,(string *)&local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
  value::~value(&local_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_78);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }